

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void searchlight_mask_test(tgestate_t *state,vischar_t *vischar)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  attribute_t attrs;
  long lVar3;
  
  if (vischar <= state->vischars) {
    lVar3 = 0x5f1;
    do {
      if (*(char *)((long)state->jmpbuf_main[0].__jmpbuf + lVar3 + -0x20) != '\0') {
        state->searchlight_state = '\x1f';
        return;
      }
      lVar3 = lVar3 + 4;
    } while ((char)lVar3 != '\x11');
    puVar1 = &state->searchlight_state;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + 0xff;
    if (uVar2 == '\0') {
      attrs = choose_game_window_attributes(state);
      set_game_window_attributes(state,attrs);
      return;
    }
  }
  return;
}

Assistant:

void searchlight_mask_test(tgestate_t *state, vischar_t *vischar)
{
  uint8_t     *buf;   /* was HL */
  attribute_t  attrs; /* was A */
  uint8_t      iters; /* was B */
  //uint8_t      C;     /* was C */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  if (vischar > &state->vischars[0])
    return; /* Skip non-hero characters. */

  /* Start testing at approximately the middle of the character. */
  buf = &state->mask_buffer[32 + 16 + 1]; /* x=1, y=12 */
  iters = 8;
  /* BUG: Original code does a fused load of BC, but doesn't use C after.
   * Probably a leftover stride constant for MASK_BUFFER_WIDTHBYTES. */
  // C = 4;
  do
  {
    if (*buf != 0)
      goto still_in_searchlight;
    buf += MASK_BUFFER_WIDTHBYTES;
  }
  while (--iters);

  /* Otherwise the hero has escaped the searchlight, so decrement the
   * counter. */
  if (--state->searchlight_state == searchlight_STATE_SEARCHING)
  {
    attrs = choose_game_window_attributes(state);
    set_game_window_attributes(state, attrs);
  }

  return;

still_in_searchlight:
  state->searchlight_state = searchlight_STATE_CAUGHT;
}